

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_all_guis.c
# Opt level: O1

void iemgui_properties(t_iemgui *iemgui,t_symbol **srl)

{
  size_t srclen;
  char *pcVar1;
  t_symbol *ptVar2;
  long lVar3;
  char label [1000];
  char acStack_408 [1000];
  
  *srl = iemgui->x_snd;
  srl[1] = iemgui->x_rcv;
  srl[2] = iemgui->x_lab;
  iemgui_all_sym2dollararg(iemgui,srl);
  lVar3 = 0;
  do {
    if (srl[lVar3] != (t_symbol *)0x0) {
      pcVar1 = srl[lVar3]->s_name;
      srclen = strlen(pcVar1);
      pcVar1 = pdgui_strnescape(acStack_408,1000,pcVar1,srclen);
      ptVar2 = gensym(pcVar1);
      srl[lVar3] = ptVar2;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  return;
}

Assistant:

void iemgui_properties(t_iemgui *iemgui, t_symbol **srl)
{
    char label[MAXPDSTRING];
    int i;
    srl[0] = iemgui->x_snd;
    srl[1] = iemgui->x_rcv;
    srl[2] = iemgui->x_lab;

    iemgui_all_sym2dollararg(iemgui, srl);

    for(i=0; i<3; i++) {
        if(srl[i])
            srl[i] = gensym(pdgui_strnescape(label, sizeof(label), srl[i]->s_name, strlen(srl[i]->s_name)));
    }
}